

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

float BinaryenConstGetValueF32(BinaryenExpressionRef expr)

{
  if (expr->_id != ConstId) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xae7,"float BinaryenConstGetValueF32(BinaryenExpressionRef)");
  }
  if (*(long *)(expr + 2) == 4) {
    return *(float *)(expr + 1);
  }
  __assert_fail("type == Type::f32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x12d,"float wasm::Literal::getf32() const");
}

Assistant:

float BinaryenConstGetValueF32(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return static_cast<Const*>(expression)->value.getf32();
}